

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void __thiscall LinkedReadsDatastore::print_status(LinkedReadsDatastore *this)

{
  pointer puVar1;
  ostream *poVar2;
  
  for (puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
  }
  poVar2 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LinkedRead Datastore from ",0x1a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->filename)._M_dataplus._M_p,(this->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," contains ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," reads, with a maximum size of ",0x1f);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in ",4);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tags.",6);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  LinkedReadsMapper::print_status(&this->mapper);
  return;
}

Assistant:

void LinkedReadsDatastore::print_status() const {
    uint64_t tagcount=0;
    LinkedTag prevtag=0;
    for (auto t:read_tag) {
        if (t != prevtag) {
            ++tagcount;
            t = prevtag;
        }
    }
    sdglib::OutputLog()<<"LinkedRead Datastore from "<<filename<<" contains "<<size()-1<<" reads, with a maximum size of " << readsize << " in "<< tagcount <<" tags."<<std::endl;
    mapper.print_status();
}